

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.cpp
# Opt level: O2

bool bounce(Block *b,ProxyWithLink *cp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pBVar3;
  Link *pLVar4;
  Block *pBVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  mapped_type *pmVar9;
  MemoryBuffer *pMVar10;
  mapped_type *pmVar11;
  ProxyWithLink *this;
  int *args_2;
  Particle p;
  int my_gid;
  int nbr_gid;
  Link *local_68;
  int local_5c;
  ProxyWithLink *local_58;
  OutgoingQueues *local_50;
  Block *local_48;
  long local_40;
  IncomingQueues *local_38;
  
  local_68 = cp->link_;
  iVar8 = (cp->super_Proxy).gid_;
  iVar6 = b->count;
  my_gid = iVar8;
  if (0 < iVar6) {
    fmt::v7::print<char[27],int&,int&,char>
              (_stderr,(char (*) [27])"[{}] enqueue {} particles\n",&my_gid,&b->count);
    iVar6 = b->count;
  }
  pLVar4 = local_68;
  local_50 = &(cp->super_Proxy).outgoing_;
  iVar8 = iVar8 * 1000;
  local_58 = cp;
  local_48 = b;
  while (0 < iVar6) {
    iVar6 = rand();
    iVar6 = iVar6 % (int)((ulong)((long)(pLVar4->neighbors_).
                                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pLVar4->neighbors_).
                                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
    iVar7 = rand();
    p.hops = iVar7 % 0x14 + 1;
    p.id = iVar8;
    fmt::v7::print<char[25],int&,int&,int&,int&,char>
              (_stderr,(char (*) [25])"[{}] -> ({},{}) -> [{}]\n",&my_gid,&p.id,&p.hops,
               &(pLVar4->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar6].gid);
    pmVar9 = std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::operator[](local_50,(pLVar4->neighbors_).
                                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                   _M_impl.super__Vector_impl_data._M_start + iVar6);
    (*(pmVar9->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar9,&p,8);
    uVar1 = local_48->count;
    uVar2 = local_48->expected_particles;
    iVar6 = uVar1 + -1;
    local_48->count = iVar6;
    local_48->expected_particles = uVar2 + 1;
    local_48->expected_hops = local_48->expected_hops + p.hops;
    iVar8 = iVar8 + 1;
  }
  local_38 = &(local_58->super_Proxy).incoming_;
  this = local_58;
  for (local_40 = 0;
      pBVar3 = (local_68->neighbors_).
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start,
      local_40 <
      (int)((ulong)((long)(local_68->neighbors_).
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pBVar3) >> 3);
      local_40 = local_40 + 1) {
    nbr_gid = pBVar3[local_40].gid;
    while( true ) {
      args_2 = &p.hops;
      pMVar10 = diy::Master::Proxy::incoming(&this->super_Proxy,nbr_gid);
      if ((ulong)((long)(pMVar10->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pMVar10->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= pMVar10->position) break;
      p.id = -1;
      p.hops = 0;
      local_5c = nbr_gid;
      pmVar11 = std::
                map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                ::operator[](local_38,&local_5c);
      (*(pmVar11->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar11,&p,8);
      fmt::v7::print<char[25],int&,int&,int&,int&,char>
                (_stderr,(char (*) [25])"[{}] <- ({},{}) <- [{}]\n",&my_gid,&p.id,args_2,&nbr_gid);
      pBVar5 = local_48;
      iVar8 = p.hops;
      p.hops = p.hops + -1;
      local_48->finished_hops = local_48->finished_hops + 1;
      if (iVar8 < 2) {
        fmt::v7::print<char[30],int&,int&,int&,char>
                  (_stderr,(char (*) [30])"[{}] finish particle ({},{})\n",&my_gid,&p.id,args_2);
        pBVar5->finished_particles = pBVar5->finished_particles + 1;
      }
      else {
        iVar8 = rand();
        pLVar4 = local_68;
        pBVar3 = (local_68->neighbors_).
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = iVar8 % (int)((ulong)((long)(local_68->neighbors_).
                                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar3) >> 3);
        fmt::v7::print<char[25],int&,int&,int&,int&,char>
                  (_stderr,(char (*) [25])"[{}] -> ({},{}) -> [{}]\n",&my_gid,&p.id,args_2,
                   &pBVar3[iVar8].gid);
        this = local_58;
        pmVar9 = std::
                 map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                 ::operator[](local_50,(pLVar4->neighbors_).
                                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                       ._M_impl.super__Vector_impl_data._M_start + iVar8);
        (*(pmVar9->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar9,&p,8);
      }
    }
  }
  return true;
}

Assistant:

bool bounce(Block*                              b,
            const diy::Master::ProxyWithLink&  cp)
{
    diy::Link* l = cp.link();
    int my_gid   = cp.gid();

    // start with every block enqueueing particles to random neighbors
    int id = my_gid * 1000;
    if (b->count > 0)
        fmt::print(stderr, "[{}] enqueue {} particles\n", my_gid, b->count);
    while (b->count > 0)
    {
        int nbr = rand() % l->size();
        Particle p(id++, 1 + rand() % 20);
        fmt::print(stderr, "[{}] -> ({},{}) -> [{}]\n", my_gid, p.id, p.hops, l->target(nbr).gid);
        cp.enqueue(l->target(nbr), p);
        b->count--;

        b->expected_particles++;
        b->expected_hops += p.hops;
    }

    // then dequeue as long as something is incoming and enqueue as long as the hop count is not exceeded
    // bounce will be called by master multiple times until no more messages are in flight anywhere
    for (int i = 0; i < l->size(); ++i)
    {
        int nbr_gid = l->target(i).gid;
        while (cp.incoming(nbr_gid))
        {
            Particle p;
            cp.dequeue(nbr_gid, p);
            fmt::print(stderr, "[{}] <- ({},{}) <- [{}]\n", my_gid, p.id, p.hops, nbr_gid);

            p.hops--;
            b->finished_hops++;
            if (p.hops > 0)
            {
                int nbr = rand() % l->size();
                fmt::print(stderr, "[{}] -> ({},{}) -> [{}]\n", my_gid, p.id, p.hops, l->target(nbr).gid);
                cp.enqueue(l->target(nbr), p);
            } else
            {
                fmt::print(stderr, "[{}] finish particle ({},{})\n", my_gid, p.id, p.hops);
                b->finished_particles++;
            }
        }
    }

    return true;
}